

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEditPrivate::repaintContents(QPlainTextEditPrivate *this,QRectF *contentsRect)

{
  long lVar1;
  bool bVar2;
  int aleft;
  int _t2;
  QRectF *this_00;
  int iVar3;
  QRectF *in_RSI;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  int yOffset;
  int xOffset;
  QPlainTextEdit *q;
  QRect r;
  QRect visibleRect;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar5;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRectF *)q_func(in_RDI);
  bVar2 = QRectF::isValid(in_RSI);
  if (bVar2) {
    aleft = horizontalOffset((QPlainTextEditPrivate *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    qVar4 = verticalOffset((QPlainTextEditPrivate *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar3 = (int)qVar4;
    iVar5 = iVar3;
    iVar6 = aleft;
    _t2 = QWidget::width((QWidget *)0x6c3456);
    QWidget::height((QWidget *)0x6c346d);
    QRect::QRect((QRect *)CONCAT44(_t2,iVar3),aleft,in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    QRectF::adjusted(this_00,(qreal)CONCAT44(iVar6,iVar5),(qreal)in_RDI,(qreal)CONCAT44(_t2,iVar3),
                     (qreal)CONCAT44(aleft,in_stack_ffffffffffffff40));
    QRectF::QRectF((QRectF *)in_RDI,(QRect *)CONCAT44(_t2,iVar3));
    QRectF::intersected((QRectF *)CONCAT44(aleft,in_stack_ffffffffffffff40),
                        (QRectF *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QRectF::toAlignedRect();
    bVar2 = QRect::isEmpty((QRect *)CONCAT44(aleft,in_stack_ffffffffffffff40));
    if (!bVar2) {
      QRect::translate((QRect *)CONCAT44(aleft,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c,
                       in_stack_ffffffffffffff38);
      QWidget::update((QWidget *)CONCAT44(_t2,iVar3),
                      (QRect *)CONCAT44(aleft,in_stack_ffffffffffffff40));
      QPlainTextEdit::updateRequest
                ((QPlainTextEdit *)CONCAT44(aleft,in_stack_ffffffffffffff40),
                 (QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),_t2);
    }
  }
  else {
    updateViewport((QPlainTextEditPrivate *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::repaintContents(const QRectF &contentsRect)
{
    Q_Q(QPlainTextEdit);
    if (!contentsRect.isValid()) {
        updateViewport();
        return;
    }
    const int xOffset = horizontalOffset();
    const int yOffset = (int)verticalOffset();
    const QRect visibleRect(xOffset, yOffset, viewport->width(), viewport->height());

    QRect r = contentsRect.adjusted(-1, -1, 1, 1).intersected(visibleRect).toAlignedRect();
    if (r.isEmpty())
        return;

    r.translate(-xOffset, -yOffset);
    viewport->update(r);
    emit q->updateRequest(r, 0);
}